

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertTrapCommand(CommandRunner *this,AssertTrapCommand *command)

{
  uint32_t uVar1;
  bool bVar2;
  undefined8 uVar3;
  Trap *this_00;
  string local_90;
  undefined4 local_6c;
  undefined1 local_68 [8];
  ActionResult result;
  AssertTrapCommand *command_local;
  CommandRunner *this_local;
  
  result.trap.root_index_ = (Index)command;
  RunAction((ActionResult *)local_68,this,
            (command->super_CommandMixin<(wabt::CommandType)9>).super_Command.line,&command->action,
            Quiet);
  bVar2 = wabt::interp::RefPtr::operator_cast_to_bool
                    ((RefPtr *)
                     &result.values.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    uVar1 = *(uint32_t *)(result.trap.root_index_ + 0xc);
    this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)
                         &result.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    wabt::interp::Trap::message_abi_cxx11_(&local_90,this_00);
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"assert_trap passed: %s",uVar3);
    std::__cxx11::string::~string((string *)&local_90);
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    uVar1 = *(uint32_t *)(result.trap.root_index_ + 0xc);
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"expected trap: \"%s\"",uVar3);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  local_6c = 1;
  ActionResult::~ActionResult((ActionResult *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertTrapCommand(
    const AssertTrapCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap) {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  PrintError(command->line, "assert_trap passed: %s",
             result.trap->message().c_str());
  return wabt::Result::Ok;
}